

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O1

int Abc_ObjExpandCubesTry(Vec_Str_t *vSop,sat_solver *pSat,Vec_Int_t *vVars)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  size_t __size;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vLits;
  int *piVar6;
  Vec_Int_t *vTemp;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  char *pSop;
  
  pSop = vSop->pArray;
  iVar4 = Abc_SopGetCubeNum(pSop);
  uVar5 = Abc_SopGetVarNum(pSop);
  vLits = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar9 = uVar5;
  }
  vLits->nSize = 0;
  vLits->nCap = uVar9;
  if (uVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar9 * 4);
  }
  vLits->pArray = piVar6;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = uVar9;
  if (uVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar9 << 2);
  }
  vTemp->pArray = piVar6;
  if (uVar5 != vVars->nSize) {
    __assert_fail("nVars == Vec_IntSize(vVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x40,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
  }
  lVar1 = (long)(int)uVar5 + 3;
  if (vSop->nSize != (int)lVar1 * iVar4 + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x41,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
  }
  if (*pSop != '\0') {
    __size = (long)(int)uVar5 << 2;
    do {
      if (vLits->nCap < (int)uVar5) {
        if (vLits->pArray == (int *)0x0) {
          piVar6 = (int *)malloc(__size);
        }
        else {
          piVar6 = (int *)realloc(vLits->pArray,__size);
        }
        vLits->pArray = piVar6;
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vLits->nCap = uVar5;
      }
      if (0 < (int)uVar5) {
        memset(vLits->pArray,0xff,(ulong)uVar5 * 4);
      }
      vLits->nSize = uVar5;
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          if (pSop[uVar7] != '-') {
            if ((long)vVars->nSize <= (long)uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vVars->pArray[uVar7] < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf1,"int Abc_Var2Lit(int, int)");
            }
            if ((long)vLits->nSize <= (long)uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            vLits->pArray[uVar7] = (uint)(pSop[uVar7] == '0') + vVars->pArray[uVar7] * 2;
            pSop[uVar7] = '-';
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,vLits,(Vec_Int_t *)0x0,vTemp,0,0,-1);
      if (0 < vLits->nSize) {
        lVar8 = 0;
        do {
          iVar3 = vLits->pArray[lVar8];
          if (iVar3 != -1) {
            if (iVar3 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf3,"int Abc_LitIsCompl(int)");
            }
            pSop[lVar8] = (byte)iVar3 & 1 ^ 0x31;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vLits->nSize);
      }
      pcVar2 = pSop + lVar1;
      pSop = pSop + lVar1;
    } while (*pcVar2 != '\0');
  }
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
    vLits->pArray = (int *)0x0;
  }
  free(vLits);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  return iVar4;
}

Assistant:

int Abc_ObjExpandCubesTry( Vec_Str_t * vSop, sat_solver * pSat, Vec_Int_t * vVars )
{
    extern int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit );

    char * pCube, * pSop = Vec_StrArray(vSop);
    int nCubes = Abc_SopGetCubeNum(pSop);
    int nVars = Abc_SopGetVarNum(pSop);

    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vTemp = Vec_IntAlloc( nVars );

    assert( nVars == Vec_IntSize(vVars) );
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
    {
        int k, Entry;
        // collect literals and clean cube
        Vec_IntFill( vLits, nVars, -1 );
        for ( k = 0; k < nVars; k++ )
        {
            if ( pCube[k] == '-' )
                continue;
            Vec_IntWriteEntry( vLits, k, Abc_Var2Lit(Vec_IntEntry(vVars, k), pCube[k] == '0') );
            pCube[k] = '-';
        }
        // expand cube
        Bmc_CollapseExpandRound( pSat, NULL, vLits, NULL, vTemp, 0, 0, -1 );
        // insert literals
        Vec_IntForEachEntry( vLits, Entry, k )
            if ( Entry != -1 )
                pCube[k] = '1' - Abc_LitIsCompl(Entry);
    }

    Vec_IntFree( vLits );
    Vec_IntFree( vTemp );
    return nCubes;
}